

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O0

void perlinInit(PerlinNoise *noise,uint64_t *seed)

{
  undefined1 uVar1;
  int iVar2;
  undefined1 *in_RDI;
  double dVar3;
  double dVar4;
  double d2;
  double i2;
  uint8_t n;
  int j;
  uint8_t *idx;
  int i;
  uint64_t *in_stack_ffffffffffffffd0;
  undefined1 *puVar5;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar6;
  
  dVar3 = nextDouble(in_stack_ffffffffffffffd0);
  *(double *)(in_RDI + 0x108) = dVar3 * 256.0;
  dVar3 = nextDouble(in_stack_ffffffffffffffd0);
  *(double *)(in_RDI + 0x110) = dVar3 * 256.0;
  dVar3 = nextDouble(in_stack_ffffffffffffffd0);
  *(double *)(in_RDI + 0x118) = dVar3 * 256.0;
  *(undefined8 *)(in_RDI + 0x120) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x128) = 0x3ff0000000000000;
  for (iVar6 = 0; iVar6 < 0x100; iVar6 = iVar6 + 1) {
    in_RDI[iVar6] = (char)iVar6;
  }
  puVar5 = in_RDI;
  for (iVar6 = 0; iVar6 < 0x100; iVar6 = iVar6 + 1) {
    iVar2 = nextInt((uint64_t *)CONCAT44(iVar6,in_stack_ffffffffffffffe8),
                    (int)((ulong)puVar5 >> 0x20));
    uVar1 = puVar5[iVar6];
    puVar5[iVar6] = puVar5[iVar2 + iVar6];
    puVar5[iVar2 + iVar6] = uVar1;
  }
  puVar5[0x100] = *puVar5;
  dVar3 = floor(*(double *)(in_RDI + 0x110));
  dVar4 = *(double *)(in_RDI + 0x110) - dVar3;
  in_RDI[0x101] = (char)(int)dVar3;
  *(double *)(in_RDI + 0x130) = dVar4;
  *(double *)(in_RDI + 0x138) = dVar4 * dVar4 * dVar4 * (dVar4 * (dVar4 * 6.0 + -15.0) + 10.0);
  return;
}

Assistant:

void perlinInit(PerlinNoise *noise, uint64_t *seed)
{
    int i = 0;
    //memset(noise, 0, sizeof(*noise));
    noise->a = nextDouble(seed) * 256.0;
    noise->b = nextDouble(seed) * 256.0;
    noise->c = nextDouble(seed) * 256.0;
    noise->amplitude = 1.0;
    noise->lacunarity = 1.0;

    uint8_t *idx = noise->d;
    for (i = 0; i < 256; i++)
    {
        idx[i] = i;
    }
    for (i = 0; i < 256; i++)
    {
        int j = nextInt(seed, 256 - i) + i;
        uint8_t n = idx[i];
        idx[i] = idx[j];
        idx[j] = n;
    }
    idx[256] = idx[0];
    double i2 = floor(noise->b);
    double d2 = noise->b - i2;
    noise->h2 = (int) i2;
    noise->d2 = d2;
    noise->t2 = d2*d2*d2 * (d2 * (d2*6.0-15.0) + 10.0);
}